

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.h
# Opt level: O0

char * cinatra::detail::parse_response
                 (char *buf,char *buf_end,int *minor_version,int *status,char **msg,size_t *msg_len,
                 http_header *headers,size_t *num_headers,size_t max_headers,int *ret)

{
  char *pcVar1;
  int *ret_00;
  int *in_RCX;
  char *pcVar2;
  char *pcVar3;
  int *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char **in_R8;
  size_t *in_R9;
  size_t *unaff_retaddr;
  http_header *in_stack_00000008;
  char *in_stack_00000010;
  bool has_upgrade;
  bool has_close;
  bool has_connection;
  char *in_stack_00000018;
  int res_;
  size_t in_stack_fffffffffffffff8;
  
  pcVar1 = parse_http_version(in_RDI,in_RSI,in_RDX,(int *)msg_len);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar2 = pcVar1 + 1;
    if (*pcVar1 == ' ') {
      if ((long)in_RSI - (long)pcVar2 < 4) {
        *(undefined4 *)msg_len = 0xfffffffe;
        pcVar1 = (char *)0x0;
      }
      else if ((*pcVar2 < '0') || ('9' < *pcVar2)) {
        *(undefined4 *)msg_len = 0xffffffff;
        pcVar1 = (char *)0x0;
      }
      else {
        pcVar3 = pcVar1 + 2;
        *in_RCX = (*pcVar2 + -0x30) * 100;
        if ((*pcVar3 < '0') || ('9' < *pcVar3)) {
          *(undefined4 *)msg_len = 0xffffffff;
          pcVar1 = (char *)0x0;
        }
        else {
          pcVar2 = pcVar1 + 3;
          *in_RCX = (*pcVar3 + -0x30) * 10 + *in_RCX;
          if ((*pcVar2 < '0') || ('9' < *pcVar2)) {
            *(undefined4 *)msg_len = 0xffffffff;
            pcVar1 = (char *)0x0;
          }
          else {
            *in_RCX = *pcVar2 + -0x30 + *in_RCX;
            if (pcVar1[4] == ' ') {
              ret_00 = (int *)get_token_to_eol(pcVar1 + 5,in_RSI,in_R8,in_R9,(int *)msg_len);
              if (ret_00 == (int *)0x0) {
                pcVar1 = (char *)0x0;
              }
              else {
                pcVar1 = parse_headers(in_stack_00000018,in_stack_00000010,in_stack_00000008,
                                       unaff_retaddr,in_stack_fffffffffffffff8,ret_00,(bool *)status
                                       ,(bool *)minor_version,(bool *)buf_end);
              }
            }
            else {
              *(undefined4 *)msg_len = 0xffffffff;
              pcVar1 = (char *)0x0;
            }
          }
        }
      }
    }
    else {
      *(undefined4 *)msg_len = 0xffffffff;
      pcVar1 = (char *)0x0;
    }
  }
  return pcVar1;
}

Assistant:

inline const char *parse_response(const char *buf, const char *buf_end,
                                  int *minor_version, int *status,
                                  const char **msg, size_t *msg_len,
                                  http_header *headers, size_t *num_headers,
                                  size_t max_headers, int *ret) {
  /* parse "HTTP/1.x" */
  if ((buf = parse_http_version(buf, buf_end, minor_version, ret)) == NULL) {
    return NULL;
  }
  /* skip space */
  if (*buf++ != ' ') {
    *ret = -1;
    return NULL;
  }
  /* parse status code, we want at least [:digit:][:digit:][:digit:]<other char>
   * to try to parse */
  if (buf_end - buf < 4) {
    *ret = -2;
    return NULL;
  }
  PARSE_INT_3(status);

  /* skip space */
  if (*buf++ != ' ') {
    *ret = -1;
    return NULL;
  }
  /* get message */
  if ((buf = get_token_to_eol(buf, buf_end, msg, msg_len, ret)) == NULL) {
    return NULL;
  }

  bool has_connection, has_close, has_upgrade;

  return parse_headers(buf, buf_end, headers, num_headers, max_headers, ret,
                       has_connection, has_close, has_upgrade);
}